

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar7;
  float fVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  float **ppfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined8 uVar19;
  long lVar20;
  undefined1 auVar21 [32];
  ulong uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  Scene *pSVar27;
  RTCIntersectArguments *pRVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  float fVar67;
  float fVar68;
  undefined1 auVar66 [16];
  float fVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_b74;
  ulong local_b70;
  Scene *local_b68;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  RTCIntersectArguments *local_b08;
  Geometry *local_b00;
  ulong local_af8;
  ulong local_af0;
  ulong local_ae8;
  RayQueryContext *local_ae0;
  ulong *local_ad8;
  long local_ad0;
  long local_ac8;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined4 local_aac;
  uint local_aa8;
  uint local_aa4;
  uint local_aa0;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  byte local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820;
  ulong local_800 [250];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800[0] != 8) {
    fVar67 = ray->tfar;
    if (0.0 <= fVar67) {
      aVar9 = (ray->dir).field_0;
      auVar37 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar32._8_4_ = 0x7fffffff;
      auVar32._0_8_ = 0x7fffffff7fffffff;
      auVar32._12_4_ = 0x7fffffff;
      auVar32 = vandps_avx512vl((undefined1  [16])aVar9,auVar32);
      auVar33._8_4_ = 0x219392ef;
      auVar33._0_8_ = 0x219392ef219392ef;
      auVar33._12_4_ = 0x219392ef;
      uVar29 = vcmpps_avx512vl(auVar32,auVar33,1);
      local_ad8 = local_800 + 1;
      auVar66._8_4_ = 0x3f800000;
      auVar66._0_8_ = 0x3f8000003f800000;
      auVar66._12_4_ = 0x3f800000;
      auVar32 = vdivps_avx(auVar66,(undefined1  [16])aVar9);
      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar15 = (bool)((byte)uVar29 & 1);
      auVar36._0_4_ = (uint)bVar15 * auVar33._0_4_ | (uint)!bVar15 * auVar32._0_4_;
      bVar15 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar15 * auVar33._4_4_ | (uint)!bVar15 * auVar32._4_4_;
      bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar15 * auVar33._8_4_ | (uint)!bVar15 * auVar32._8_4_;
      bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar15 * auVar33._12_4_ | (uint)!bVar15 * auVar32._12_4_;
      auVar34._8_4_ = 0x3f7ffffa;
      auVar34._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar34._12_4_ = 0x3f7ffffa;
      auVar34 = vmulps_avx512vl(auVar36,auVar34);
      auVar35._8_4_ = 0x3f800003;
      auVar35._0_8_ = 0x3f8000033f800003;
      auVar35._12_4_ = 0x3f800003;
      auVar35 = vmulps_avx512vl(auVar36,auVar35);
      auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar78 = ZEXT1664(auVar32);
      auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar79 = ZEXT1664(auVar32);
      auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar80 = ZEXT1664(auVar32);
      auVar32 = vbroadcastss_avx512vl(auVar34);
      auVar81 = ZEXT1664(auVar32);
      auVar32 = vmovshdup_avx(auVar34);
      auVar33 = vshufps_avx512vl(auVar34,auVar34,0x55);
      auVar82 = ZEXT1664(auVar33);
      auVar33 = vshufpd_avx(auVar34,auVar34,1);
      auVar36 = vshufps_avx512vl(auVar34,auVar34,0xaa);
      auVar83 = ZEXT1664(auVar36);
      fVar62 = auVar35._0_4_;
      local_b30 = vshufps_avx(auVar35,auVar35,0x55);
      auVar74 = ZEXT1664(local_b30);
      local_b40 = vshufps_avx(auVar35,auVar35,0xaa);
      auVar75 = ZEXT1664(local_b40);
      local_ae8 = (ulong)(auVar34._0_4_ < 0.0) << 4;
      local_af0 = (ulong)(auVar32._0_4_ < 0.0) << 4 | 0x20;
      uVar29 = (ulong)(auVar33._0_4_ < 0.0) << 4 | 0x40;
      uVar30 = local_ae8 ^ 0x10;
      uVar31 = local_af0 ^ 0x10;
      local_b50._0_4_ = auVar37._0_4_;
      local_b50._4_4_ = local_b50._0_4_;
      local_b50._8_4_ = local_b50._0_4_;
      local_b50._12_4_ = local_b50._0_4_;
      auVar65 = ZEXT1664(local_b50);
      local_b60._4_4_ = fVar67;
      local_b60._0_4_ = fVar67;
      local_b60._8_4_ = fVar67;
      local_b60._12_4_ = fVar67;
      auVar71 = ZEXT1664(local_b60);
      local_b20 = fVar62;
      fStack_b1c = fVar62;
      fStack_b18 = fVar62;
      fStack_b14 = fVar62;
      local_ae0 = context;
      fVar67 = fVar62;
      fVar68 = fVar62;
      fVar69 = fVar62;
LAB_01be34e2:
      if (local_ad8 != local_800) {
        uVar26 = local_ad8[-1];
        local_ad8 = local_ad8 + -1;
        while ((uVar26 & 8) == 0) {
          auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + local_ae8),auVar78._0_16_
                                   );
          auVar32 = vmulps_avx512vl(auVar81._0_16_,auVar32);
          auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + local_af0),auVar79._0_16_
                                   );
          auVar37 = vmulps_avx512vl(auVar82._0_16_,auVar37);
          auVar32 = vmaxps_avx(auVar32,auVar37);
          auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar29),auVar80._0_16_);
          auVar37 = vmulps_avx512vl(auVar83._0_16_,auVar37);
          auVar37 = vmaxps_avx(auVar37,auVar65._0_16_);
          auVar32 = vmaxps_avx(auVar32,auVar37);
          auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar30),auVar78._0_16_);
          auVar61._0_4_ = fVar62 * auVar37._0_4_;
          auVar61._4_4_ = fVar67 * auVar37._4_4_;
          auVar61._8_4_ = fVar68 * auVar37._8_4_;
          auVar61._12_4_ = fVar69 * auVar37._12_4_;
          auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar31),auVar79._0_16_);
          auVar63._0_4_ = auVar74._0_4_ * auVar37._0_4_;
          auVar63._4_4_ = auVar74._4_4_ * auVar37._4_4_;
          auVar63._8_4_ = auVar74._8_4_ * auVar37._8_4_;
          auVar63._12_4_ = auVar74._12_4_ * auVar37._12_4_;
          auVar37 = vminps_avx(auVar61,auVar63);
          auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + (uVar29 ^ 0x10)),
                                    auVar80._0_16_);
          auVar64._0_4_ = auVar75._0_4_ * auVar33._0_4_;
          auVar64._4_4_ = auVar75._4_4_ * auVar33._4_4_;
          auVar64._8_4_ = auVar75._8_4_ * auVar33._8_4_;
          auVar64._12_4_ = auVar75._12_4_ * auVar33._12_4_;
          auVar33 = vminps_avx(auVar64,auVar71._0_16_);
          auVar37 = vminps_avx(auVar37,auVar33);
          uVar25 = vcmpps_avx512vl(auVar32,auVar37,2);
          if ((char)uVar25 == '\0') goto LAB_01be34e2;
          uVar22 = uVar26 & 0xfffffffffffffff0;
          lVar20 = 0;
          for (uVar26 = uVar25; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
            lVar20 = lVar20 + 1;
          }
          uVar26 = *(ulong *)(uVar22 + lVar20 * 8);
          uVar24 = (uint)uVar25 - 1 & (uint)uVar25;
          uVar25 = (ulong)uVar24;
          if (uVar24 != 0) {
            do {
              *local_ad8 = uVar26;
              local_ad8 = local_ad8 + 1;
              lVar20 = 0;
              for (uVar26 = uVar25; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                lVar20 = lVar20 + 1;
              }
              uVar25 = uVar25 - 1 & uVar25;
              uVar26 = *(ulong *)(uVar22 + lVar20 * 8);
            } while (uVar25 != 0);
          }
        }
        local_ac8 = (ulong)((uint)uVar26 & 0xf) - 8;
        uVar26 = uVar26 & 0xfffffffffffffff0;
        for (local_ad0 = 0; local_ad0 != local_ac8; local_ad0 = local_ad0 + 1) {
          lVar23 = local_ad0 * 0x60;
          pSVar27 = local_ae0->scene;
          local_b68 = pSVar27;
          ppfVar10 = (pSVar27->vertices).items;
          pfVar11 = ppfVar10[*(uint *)(uVar26 + 0x48 + lVar23)];
          auVar39._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar26 + 0x28 + lVar23));
          auVar39._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar26 + 8 + lVar23));
          pfVar12 = ppfVar10[*(uint *)(uVar26 + 0x40 + lVar23)];
          auVar40._16_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar26 + 0x20 + lVar23));
          auVar40._0_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar26 + lVar23));
          pfVar13 = ppfVar10[*(uint *)(uVar26 + 0x4c + lVar23)];
          auVar41._16_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar26 + 0x2c + lVar23));
          auVar41._0_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar26 + 0xc + lVar23));
          pfVar14 = ppfVar10[*(uint *)(uVar26 + 0x44 + lVar23)];
          auVar45._16_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar26 + 0x24 + lVar23));
          auVar45._0_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar26 + 4 + lVar23));
          lVar20 = uVar26 + 0x40 + lVar23;
          local_9e0 = *(undefined8 *)(lVar20 + 0x10);
          uStack_9d8 = *(undefined8 *)(lVar20 + 0x18);
          uStack_9d0 = local_9e0;
          uStack_9c8 = uStack_9d8;
          lVar20 = uVar26 + 0x50 + lVar23;
          local_a00 = *(undefined8 *)(lVar20 + 0x10);
          uStack_9f8 = *(undefined8 *)(lVar20 + 0x18);
          auVar33 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar26 + 0x10 + lVar23)),
                                  *(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar26 + 0x18 + lVar23)));
          auVar32 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar26 + 0x10 + lVar23)),
                                  *(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar26 + 0x18 + lVar23)));
          auVar34 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar14 + *(uint *)(uVar26 + 0x14 + lVar23)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar26 + 0x1c + lVar23)));
          auVar37 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar14 + *(uint *)(uVar26 + 0x14 + lVar23)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar26 + 0x1c + lVar23)));
          auVar35 = vunpcklps_avx(auVar32,auVar37);
          auVar36 = vunpcklps_avx(auVar33,auVar34);
          auVar32 = vunpckhps_avx(auVar33,auVar34);
          auVar34 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar26 + 0x30 + lVar23)),
                                  *(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar26 + 0x38 + lVar23)));
          auVar37 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar26 + 0x30 + lVar23)),
                                  *(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar26 + 0x38 + lVar23)));
          auVar66 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar14 + *(uint *)(uVar26 + 0x34 + lVar23)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar26 + 0x3c + lVar23)));
          auVar33 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar14 + *(uint *)(uVar26 + 0x34 + lVar23)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar26 + 0x3c + lVar23)));
          auVar33 = vunpcklps_avx(auVar37,auVar33);
          auVar61 = vunpcklps_avx(auVar34,auVar66);
          auVar37 = vunpckhps_avx(auVar34,auVar66);
          uStack_9f0 = local_a00;
          uStack_9e8 = uStack_9f8;
          auVar60 = vunpcklps_avx(auVar45,auVar41);
          auVar59 = vunpcklps_avx(auVar40,auVar39);
          auVar55 = vunpcklps_avx(auVar59,auVar60);
          auVar59 = vunpckhps_avx(auVar59,auVar60);
          auVar60 = vunpckhps_avx(auVar45,auVar41);
          auVar42 = vunpckhps_avx(auVar40,auVar39);
          auVar42 = vunpcklps_avx(auVar42,auVar60);
          auVar43._16_16_ = auVar36;
          auVar43._0_16_ = auVar36;
          auVar46._16_16_ = auVar32;
          auVar46._0_16_ = auVar32;
          auVar44._16_16_ = auVar35;
          auVar44._0_16_ = auVar35;
          auVar48._16_16_ = auVar61;
          auVar48._0_16_ = auVar61;
          auVar49._16_16_ = auVar37;
          auVar49._0_16_ = auVar37;
          uVar7 = *(undefined4 *)&(ray->org).field_0;
          auVar50._4_4_ = uVar7;
          auVar50._0_4_ = uVar7;
          auVar50._8_4_ = uVar7;
          auVar50._12_4_ = uVar7;
          auVar50._16_4_ = uVar7;
          auVar50._20_4_ = uVar7;
          auVar50._24_4_ = uVar7;
          auVar50._28_4_ = uVar7;
          auVar38 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
          auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
          uVar7 = *(undefined4 *)&(ray->dir).field_0;
          auVar70._4_4_ = uVar7;
          auVar70._0_4_ = uVar7;
          auVar70._8_4_ = uVar7;
          auVar70._12_4_ = uVar7;
          auVar70._16_4_ = uVar7;
          auVar70._20_4_ = uVar7;
          auVar70._24_4_ = uVar7;
          auVar70._28_4_ = uVar7;
          auVar47._16_16_ = auVar33;
          auVar47._0_16_ = auVar33;
          uVar7 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
          auVar73._4_4_ = uVar7;
          auVar73._0_4_ = uVar7;
          auVar73._8_4_ = uVar7;
          auVar73._12_4_ = uVar7;
          auVar73._16_4_ = uVar7;
          auVar73._20_4_ = uVar7;
          auVar73._24_4_ = uVar7;
          auVar73._28_4_ = uVar7;
          fVar8 = (ray->dir).field_0.m128[2];
          auVar76._4_4_ = fVar8;
          auVar76._0_4_ = fVar8;
          auVar76._8_4_ = fVar8;
          auVar76._12_4_ = fVar8;
          auVar76._16_4_ = fVar8;
          auVar76._20_4_ = fVar8;
          auVar76._24_4_ = fVar8;
          auVar76._28_4_ = fVar8;
          auVar60 = vsubps_avx(auVar55,auVar50);
          auVar40 = vsubps_avx512vl(auVar59,auVar38);
          auVar41 = vsubps_avx512vl(auVar42,auVar39);
          auVar42 = vsubps_avx512vl(auVar43,auVar50);
          auVar43 = vsubps_avx512vl(auVar46,auVar38);
          auVar44 = vsubps_avx512vl(auVar44,auVar39);
          auVar45 = vsubps_avx512vl(auVar48,auVar50);
          auVar46 = vsubps_avx512vl(auVar49,auVar38);
          auVar39 = vsubps_avx512vl(auVar47,auVar39);
          auVar47 = vsubps_avx512vl(auVar45,auVar60);
          auVar59 = vsubps_avx(auVar46,auVar40);
          auVar48 = vsubps_avx512vl(auVar39,auVar41);
          auVar49 = vsubps_avx512vl(auVar60,auVar42);
          auVar50 = vsubps_avx512vl(auVar40,auVar43);
          auVar51 = vsubps_avx512vl(auVar41,auVar44);
          auVar52 = vsubps_avx512vl(auVar42,auVar45);
          auVar53 = vsubps_avx512vl(auVar43,auVar46);
          auVar54 = vsubps_avx512vl(auVar44,auVar39);
          auVar38 = vaddps_avx512vl(auVar45,auVar60);
          auVar77._0_4_ = auVar46._0_4_ + auVar40._0_4_;
          auVar77._4_4_ = auVar46._4_4_ + auVar40._4_4_;
          auVar77._8_4_ = auVar46._8_4_ + auVar40._8_4_;
          auVar77._12_4_ = auVar46._12_4_ + auVar40._12_4_;
          auVar77._16_4_ = auVar46._16_4_ + auVar40._16_4_;
          auVar77._20_4_ = auVar46._20_4_ + auVar40._20_4_;
          auVar77._24_4_ = auVar46._24_4_ + auVar40._24_4_;
          auVar77._28_4_ = auVar46._28_4_ + auVar40._28_4_;
          auVar55 = vaddps_avx512vl(auVar39,auVar41);
          auVar56 = vmulps_avx512vl(auVar77,auVar48);
          auVar56 = vfmsub231ps_avx512vl(auVar56,auVar59,auVar55);
          auVar55 = vmulps_avx512vl(auVar55,auVar47);
          auVar57 = vfmsub231ps_avx512vl(auVar55,auVar48,auVar38);
          auVar55._4_4_ = auVar59._4_4_ * auVar38._4_4_;
          auVar55._0_4_ = auVar59._0_4_ * auVar38._0_4_;
          auVar55._8_4_ = auVar59._8_4_ * auVar38._8_4_;
          auVar55._12_4_ = auVar59._12_4_ * auVar38._12_4_;
          auVar55._16_4_ = auVar59._16_4_ * auVar38._16_4_;
          auVar55._20_4_ = auVar59._20_4_ * auVar38._20_4_;
          auVar55._24_4_ = auVar59._24_4_ * auVar38._24_4_;
          auVar55._28_4_ = auVar38._28_4_;
          auVar32 = vfmsub231ps_fma(auVar55,auVar47,auVar77);
          auVar58._0_4_ = fVar8 * auVar32._0_4_;
          auVar58._4_4_ = fVar8 * auVar32._4_4_;
          auVar58._8_4_ = fVar8 * auVar32._8_4_;
          auVar58._12_4_ = fVar8 * auVar32._12_4_;
          auVar58._16_4_ = fVar8 * 0.0;
          auVar58._20_4_ = fVar8 * 0.0;
          auVar58._24_4_ = fVar8 * 0.0;
          auVar58._28_4_ = 0;
          auVar55 = vfmadd231ps_avx512vl(auVar58,auVar73,auVar57);
          local_9c0 = vfmadd231ps_avx512vl(auVar55,auVar70,auVar56);
          auVar55 = vaddps_avx512vl(auVar60,auVar42);
          auVar38 = vaddps_avx512vl(auVar40,auVar43);
          auVar56 = vaddps_avx512vl(auVar41,auVar44);
          auVar57 = vmulps_avx512vl(auVar38,auVar51);
          auVar57 = vfmsub231ps_avx512vl(auVar57,auVar50,auVar56);
          auVar56 = vmulps_avx512vl(auVar56,auVar49);
          auVar56 = vfmsub231ps_avx512vl(auVar56,auVar51,auVar55);
          auVar55 = vmulps_avx512vl(auVar55,auVar50);
          auVar55 = vfmsub231ps_avx512vl(auVar55,auVar49,auVar38);
          auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar38._4_4_ = fVar8 * auVar55._4_4_;
          auVar38._0_4_ = fVar8 * auVar55._0_4_;
          auVar38._8_4_ = fVar8 * auVar55._8_4_;
          auVar38._12_4_ = fVar8 * auVar55._12_4_;
          auVar38._16_4_ = fVar8 * auVar55._16_4_;
          auVar38._20_4_ = fVar8 * auVar55._20_4_;
          auVar38._24_4_ = fVar8 * auVar55._24_4_;
          auVar38._28_4_ = auVar55._28_4_;
          auVar55 = vfmadd231ps_avx512vl(auVar38,auVar73,auVar56);
          local_9a0 = vfmadd231ps_avx512vl(auVar55,auVar70,auVar57);
          auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar42 = vaddps_avx512vl(auVar42,auVar45);
          auVar38 = vaddps_avx512vl(auVar43,auVar46);
          auVar39 = vaddps_avx512vl(auVar44,auVar39);
          auVar43 = vmulps_avx512vl(auVar38,auVar54);
          auVar43 = vfmsub231ps_avx512vl(auVar43,auVar53,auVar39);
          auVar39 = vmulps_avx512vl(auVar39,auVar52);
          auVar39 = vfmsub231ps_avx512vl(auVar39,auVar54,auVar42);
          auVar42 = vmulps_avx512vl(auVar42,auVar53);
          auVar42 = vfmsub231ps_avx512vl(auVar42,auVar52,auVar38);
          auVar42 = vmulps_avx512vl(auVar76,auVar42);
          auVar42 = vfmadd231ps_avx512vl(auVar42,auVar73,auVar39);
          auVar38 = vfmadd231ps_avx512vl(auVar42,auVar70,auVar43);
          auVar56._0_4_ = local_9a0._0_4_ + local_9c0._0_4_;
          auVar56._4_4_ = local_9a0._4_4_ + local_9c0._4_4_;
          auVar56._8_4_ = local_9a0._8_4_ + local_9c0._8_4_;
          auVar56._12_4_ = local_9a0._12_4_ + local_9c0._12_4_;
          auVar56._16_4_ = local_9a0._16_4_ + local_9c0._16_4_;
          auVar56._20_4_ = local_9a0._20_4_ + local_9c0._20_4_;
          auVar56._24_4_ = local_9a0._24_4_ + local_9c0._24_4_;
          auVar56._28_4_ = local_9a0._28_4_ + local_9c0._28_4_;
          local_980 = vaddps_avx512vl(auVar38,auVar56);
          vandps_avx512vl(local_980,auVar55);
          auVar42._8_4_ = 0x34000000;
          auVar42._0_8_ = 0x3400000034000000;
          auVar42._12_4_ = 0x34000000;
          auVar42._16_4_ = 0x34000000;
          auVar42._20_4_ = 0x34000000;
          auVar42._24_4_ = 0x34000000;
          auVar42._28_4_ = 0x34000000;
          auVar42 = vmulps_avx512vl(local_980,auVar42);
          auVar39 = vminps_avx512vl(local_9c0,local_9a0);
          auVar39 = vminps_avx512vl(auVar39,auVar38);
          auVar43 = vxorps_avx512vl(auVar42,auVar58);
          uVar16 = vcmpps_avx512vl(auVar39,auVar43,5);
          auVar39 = vmaxps_avx512vl(local_9c0,local_9a0);
          auVar38 = vmaxps_avx512vl(auVar39,auVar38);
          uVar17 = vcmpps_avx512vl(auVar38,auVar42,2);
          local_900 = (byte)uVar16 | (byte)uVar17;
          fVar67 = fStack_b1c;
          fVar68 = fStack_b18;
          fVar69 = fStack_b14;
          fVar62 = local_b20;
          if (local_900 == 0) {
LAB_01be3e0e:
            auVar74 = ZEXT1664(local_b30);
            auVar75 = ZEXT1664(local_b40);
            auVar65 = ZEXT1664(local_b50);
            auVar71 = ZEXT1664(local_b60);
          }
          else {
            auVar42 = vmulps_avx512vl(auVar48,auVar50);
            auVar38 = vmulps_avx512vl(auVar47,auVar51);
            auVar39 = vmulps_avx512vl(auVar59,auVar49);
            auVar43 = vmulps_avx512vl(auVar51,auVar53);
            auVar44 = vmulps_avx512vl(auVar49,auVar54);
            auVar45 = vmulps_avx512vl(auVar50,auVar52);
            auVar59 = vfmsub213ps_avx512vl(auVar59,auVar51,auVar42);
            auVar46 = vfmsub213ps_avx512vl(auVar48,auVar49,auVar38);
            auVar47 = vfmsub213ps_avx512vl(auVar47,auVar50,auVar39);
            auVar48 = vfmsub213ps_avx512vl(auVar54,auVar50,auVar43);
            auVar50 = vfmsub213ps_avx512vl(auVar52,auVar51,auVar44);
            auVar49 = vfmsub213ps_avx512vl(auVar53,auVar49,auVar45);
            vandps_avx512vl(auVar42,auVar55);
            vandps_avx512vl(auVar43,auVar55);
            uVar25 = vcmpps_avx512vl(auVar49,auVar49,1);
            vandps_avx512vl(auVar38,auVar55);
            vandps_avx512vl(auVar44,auVar55);
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            uVar22 = vcmpps_avx512vl(auVar49,auVar49,1);
            vandps_avx512vl(auVar39,auVar55);
            vandps_avx512vl(auVar45,auVar55);
            uVar18 = vcmpps_avx512vl(auVar42,auVar42,1);
            bVar15 = (bool)((byte)uVar25 & 1);
            local_960._0_4_ = (float)((uint)bVar15 * auVar59._0_4_ | (uint)!bVar15 * auVar48._0_4_);
            bVar15 = (bool)((byte)(uVar25 >> 1) & 1);
            local_960._4_4_ = (float)((uint)bVar15 * auVar59._4_4_ | (uint)!bVar15 * auVar48._4_4_);
            bVar15 = (bool)((byte)(uVar25 >> 2) & 1);
            local_960._8_4_ = (float)((uint)bVar15 * auVar59._8_4_ | (uint)!bVar15 * auVar48._8_4_);
            bVar15 = (bool)((byte)(uVar25 >> 3) & 1);
            local_960._12_4_ =
                 (float)((uint)bVar15 * auVar59._12_4_ | (uint)!bVar15 * auVar48._12_4_);
            bVar15 = (bool)((byte)(uVar25 >> 4) & 1);
            local_960._16_4_ =
                 (float)((uint)bVar15 * auVar59._16_4_ | (uint)!bVar15 * auVar48._16_4_);
            bVar15 = (bool)((byte)(uVar25 >> 5) & 1);
            local_960._20_4_ =
                 (float)((uint)bVar15 * auVar59._20_4_ | (uint)!bVar15 * auVar48._20_4_);
            bVar15 = (bool)((byte)(uVar25 >> 6) & 1);
            local_960._24_4_ =
                 (float)((uint)bVar15 * auVar59._24_4_ | (uint)!bVar15 * auVar48._24_4_);
            bVar15 = SUB81(uVar25 >> 7,0);
            local_960._28_4_ = (uint)bVar15 * auVar59._28_4_ | (uint)!bVar15 * auVar48._28_4_;
            bVar15 = (bool)((byte)uVar22 & 1);
            local_940._0_4_ = (float)((uint)bVar15 * auVar46._0_4_ | (uint)!bVar15 * auVar50._0_4_);
            bVar15 = (bool)((byte)(uVar22 >> 1) & 1);
            local_940._4_4_ = (float)((uint)bVar15 * auVar46._4_4_ | (uint)!bVar15 * auVar50._4_4_);
            bVar15 = (bool)((byte)(uVar22 >> 2) & 1);
            local_940._8_4_ = (float)((uint)bVar15 * auVar46._8_4_ | (uint)!bVar15 * auVar50._8_4_);
            bVar15 = (bool)((byte)(uVar22 >> 3) & 1);
            local_940._12_4_ =
                 (float)((uint)bVar15 * auVar46._12_4_ | (uint)!bVar15 * auVar50._12_4_);
            bVar15 = (bool)((byte)(uVar22 >> 4) & 1);
            local_940._16_4_ =
                 (float)((uint)bVar15 * auVar46._16_4_ | (uint)!bVar15 * auVar50._16_4_);
            bVar15 = (bool)((byte)(uVar22 >> 5) & 1);
            local_940._20_4_ =
                 (float)((uint)bVar15 * auVar46._20_4_ | (uint)!bVar15 * auVar50._20_4_);
            bVar15 = (bool)((byte)(uVar22 >> 6) & 1);
            local_940._24_4_ =
                 (float)((uint)bVar15 * auVar46._24_4_ | (uint)!bVar15 * auVar50._24_4_);
            bVar15 = SUB81(uVar22 >> 7,0);
            local_940._28_4_ = (uint)bVar15 * auVar46._28_4_ | (uint)!bVar15 * auVar50._28_4_;
            bVar15 = (bool)((byte)uVar18 & 1);
            local_920._0_4_ = (float)((uint)bVar15 * auVar47._0_4_ | (uint)!bVar15 * auVar49._0_4_);
            bVar15 = (bool)((byte)(uVar18 >> 1) & 1);
            local_920._4_4_ = (float)((uint)bVar15 * auVar47._4_4_ | (uint)!bVar15 * auVar49._4_4_);
            bVar15 = (bool)((byte)(uVar18 >> 2) & 1);
            local_920._8_4_ = (float)((uint)bVar15 * auVar47._8_4_ | (uint)!bVar15 * auVar49._8_4_);
            bVar15 = (bool)((byte)(uVar18 >> 3) & 1);
            local_920._12_4_ =
                 (float)((uint)bVar15 * auVar47._12_4_ | (uint)!bVar15 * auVar49._12_4_);
            bVar15 = (bool)((byte)(uVar18 >> 4) & 1);
            local_920._16_4_ =
                 (float)((uint)bVar15 * auVar47._16_4_ | (uint)!bVar15 * auVar49._16_4_);
            bVar15 = (bool)((byte)(uVar18 >> 5) & 1);
            local_920._20_4_ =
                 (float)((uint)bVar15 * auVar47._20_4_ | (uint)!bVar15 * auVar49._20_4_);
            bVar15 = (bool)((byte)(uVar18 >> 6) & 1);
            local_920._24_4_ =
                 (float)((uint)bVar15 * auVar47._24_4_ | (uint)!bVar15 * auVar49._24_4_);
            bVar15 = SUB81(uVar18 >> 7,0);
            local_920._28_4_ = (uint)bVar15 * auVar47._28_4_ | (uint)!bVar15 * auVar49._28_4_;
            auVar52._4_4_ = fVar8 * local_920._4_4_;
            auVar52._0_4_ = fVar8 * local_920._0_4_;
            auVar52._8_4_ = fVar8 * local_920._8_4_;
            auVar52._12_4_ = fVar8 * local_920._12_4_;
            auVar52._16_4_ = fVar8 * local_920._16_4_;
            auVar52._20_4_ = fVar8 * local_920._20_4_;
            auVar52._24_4_ = fVar8 * local_920._24_4_;
            auVar52._28_4_ = fVar8;
            auVar32 = vfmadd213ps_fma(auVar73,local_940,auVar52);
            auVar32 = vfmadd213ps_fma(auVar70,local_960,ZEXT1632(auVar32));
            auVar55 = ZEXT1632(CONCAT412(auVar32._12_4_ + auVar32._12_4_,
                                         CONCAT48(auVar32._8_4_ + auVar32._8_4_,
                                                  CONCAT44(auVar32._4_4_ + auVar32._4_4_,
                                                           auVar32._0_4_ + auVar32._0_4_))));
            auVar53._0_4_ = auVar41._0_4_ * local_920._0_4_;
            auVar53._4_4_ = auVar41._4_4_ * local_920._4_4_;
            auVar53._8_4_ = auVar41._8_4_ * local_920._8_4_;
            auVar53._12_4_ = auVar41._12_4_ * local_920._12_4_;
            auVar53._16_4_ = auVar41._16_4_ * local_920._16_4_;
            auVar53._20_4_ = auVar41._20_4_ * local_920._20_4_;
            auVar53._24_4_ = auVar41._24_4_ * local_920._24_4_;
            auVar53._28_4_ = 0;
            auVar32 = vfmadd213ps_fma(auVar40,local_940,auVar53);
            auVar37 = vfmadd213ps_fma(auVar60,local_960,ZEXT1632(auVar32));
            auVar59 = vrcp14ps_avx512vl(auVar55);
            auVar60._8_4_ = 0x3f800000;
            auVar60._0_8_ = 0x3f8000003f800000;
            auVar60._12_4_ = 0x3f800000;
            auVar60._16_4_ = 0x3f800000;
            auVar60._20_4_ = 0x3f800000;
            auVar60._24_4_ = 0x3f800000;
            auVar60._28_4_ = 0x3f800000;
            auVar60 = vfnmadd213ps_avx512vl(auVar59,auVar55,auVar60);
            auVar32 = vfmadd132ps_fma(auVar60,auVar59,auVar59);
            local_8a0 = ZEXT1632(CONCAT412((auVar37._12_4_ + auVar37._12_4_) * auVar32._12_4_,
                                           CONCAT48((auVar37._8_4_ + auVar37._8_4_) * auVar32._8_4_,
                                                    CONCAT44((auVar37._4_4_ + auVar37._4_4_) *
                                                             auVar32._4_4_,
                                                             (auVar37._0_4_ + auVar37._0_4_) *
                                                             auVar32._0_4_))));
            uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar59._4_4_ = uVar7;
            auVar59._0_4_ = uVar7;
            auVar59._8_4_ = uVar7;
            auVar59._12_4_ = uVar7;
            auVar59._16_4_ = uVar7;
            auVar59._20_4_ = uVar7;
            auVar59._24_4_ = uVar7;
            auVar59._28_4_ = uVar7;
            uVar16 = vcmpps_avx512vl(local_8a0,auVar59,0xd);
            auVar60 = vxorps_avx512vl(auVar55,auVar42);
            fVar8 = ray->tfar;
            auVar51._4_4_ = fVar8;
            auVar51._0_4_ = fVar8;
            auVar51._8_4_ = fVar8;
            auVar51._12_4_ = fVar8;
            auVar51._16_4_ = fVar8;
            auVar51._20_4_ = fVar8;
            auVar51._24_4_ = fVar8;
            auVar51._28_4_ = fVar8;
            uVar17 = vcmpps_avx512vl(local_8a0,auVar51,2);
            uVar19 = vcmpps_avx512vl(auVar55,auVar60,4);
            local_900 = (byte)uVar16 & (byte)uVar17 & (byte)uVar19 & local_900;
            if (local_900 == 0) goto LAB_01be3e0e;
            local_820 = 0xf0;
            auVar54._8_4_ = 0x219392ef;
            auVar54._0_8_ = 0x219392ef219392ef;
            auVar54._12_4_ = 0x219392ef;
            auVar54._16_4_ = 0x219392ef;
            auVar54._20_4_ = 0x219392ef;
            auVar54._24_4_ = 0x219392ef;
            auVar54._28_4_ = 0x219392ef;
            uVar25 = vcmpps_avx512vl(local_980,auVar54,5);
            auVar59 = vrcp14ps_avx512vl(local_980);
            auVar72._8_4_ = 0x3f800000;
            auVar72._0_8_ = 0x3f8000003f800000;
            auVar72._12_4_ = 0x3f800000;
            auVar72._16_4_ = 0x3f800000;
            auVar72._20_4_ = 0x3f800000;
            auVar72._24_4_ = 0x3f800000;
            auVar72._28_4_ = 0x3f800000;
            auVar32 = vfnmadd213ps_fma(local_980,auVar59,auVar72);
            auVar60 = vfmadd132ps_avx512vl(ZEXT1632(auVar32),auVar59,auVar59);
            fVar8 = (float)((uint)((byte)uVar25 & 1) * auVar60._0_4_);
            fVar1 = (float)((uint)((byte)(uVar25 >> 1) & 1) * auVar60._4_4_);
            fVar2 = (float)((uint)((byte)(uVar25 >> 2) & 1) * auVar60._8_4_);
            fVar3 = (float)((uint)((byte)(uVar25 >> 3) & 1) * auVar60._12_4_);
            fVar4 = (float)((uint)((byte)(uVar25 >> 4) & 1) * auVar60._16_4_);
            fVar5 = (float)((uint)((byte)(uVar25 >> 5) & 1) * auVar60._20_4_);
            fVar6 = (float)((uint)((byte)(uVar25 >> 6) & 1) * auVar60._24_4_);
            auVar57._4_4_ = fVar1 * local_9c0._4_4_;
            auVar57._0_4_ = fVar8 * local_9c0._0_4_;
            auVar57._8_4_ = fVar2 * local_9c0._8_4_;
            auVar57._12_4_ = fVar3 * local_9c0._12_4_;
            auVar57._16_4_ = fVar4 * local_9c0._16_4_;
            auVar57._20_4_ = fVar5 * local_9c0._20_4_;
            auVar57._24_4_ = fVar6 * local_9c0._24_4_;
            auVar57._28_4_ = local_9c0._28_4_;
            auVar60 = vminps_avx(auVar57,auVar72);
            auVar21._4_4_ = local_9a0._4_4_ * fVar1;
            auVar21._0_4_ = local_9a0._0_4_ * fVar8;
            auVar21._8_4_ = local_9a0._8_4_ * fVar2;
            auVar21._12_4_ = local_9a0._12_4_ * fVar3;
            auVar21._16_4_ = local_9a0._16_4_ * fVar4;
            auVar21._20_4_ = local_9a0._20_4_ * fVar5;
            auVar21._24_4_ = local_9a0._24_4_ * fVar6;
            auVar21._28_4_ = auVar59._28_4_;
            auVar59 = vminps_avx(auVar21,auVar72);
            auVar42 = vsubps_avx(auVar72,auVar60);
            auVar55 = vsubps_avx(auVar72,auVar59);
            local_8c0 = vblendps_avx(auVar59,auVar42,0xf0);
            local_8e0 = vblendps_avx(auVar60,auVar55,0xf0);
            local_880._4_4_ = local_960._4_4_ * 1.0;
            local_880._0_4_ = local_960._0_4_ * 1.0;
            local_880._8_4_ = local_960._8_4_ * 1.0;
            local_880._12_4_ = local_960._12_4_ * 1.0;
            local_880._16_4_ = local_960._16_4_ * -1.0;
            local_880._20_4_ = local_960._20_4_ * -1.0;
            local_880._24_4_ = local_960._24_4_ * -1.0;
            local_880._28_4_ = local_960._28_4_;
            local_860._4_4_ = local_940._4_4_ * 1.0;
            local_860._0_4_ = local_940._0_4_ * 1.0;
            local_860._8_4_ = local_940._8_4_ * 1.0;
            local_860._12_4_ = local_940._12_4_ * 1.0;
            local_860._16_4_ = local_940._16_4_ * -1.0;
            local_860._20_4_ = local_940._20_4_ * -1.0;
            local_860._24_4_ = local_940._24_4_ * -1.0;
            local_860._28_4_ = local_940._28_4_;
            local_840._4_4_ = local_920._4_4_ * 1.0;
            local_840._0_4_ = local_920._0_4_ * 1.0;
            local_840._8_4_ = local_920._8_4_ * 1.0;
            local_840._12_4_ = local_920._12_4_ * 1.0;
            local_840._16_4_ = local_920._16_4_ * -1.0;
            local_840._20_4_ = local_920._20_4_ * -1.0;
            local_840._24_4_ = local_920._24_4_ * -1.0;
            local_840._28_4_ = local_920._28_4_;
            local_af8 = (ulong)local_900;
            auVar74 = ZEXT1664(local_b30);
            auVar75 = ZEXT1664(local_b40);
            auVar65 = ZEXT1664(local_b50);
            auVar71 = ZEXT1664(local_b60);
            do {
              local_b70 = 0;
              for (uVar25 = local_af8; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000)
              {
                local_b70 = local_b70 + 1;
              }
              local_aa8 = *(uint *)((long)&local_9e0 + local_b70 * 4);
              local_b00 = (pSVar27->geometries).items[local_aa8].ptr;
              if ((local_b00->mask & ray->mask) == 0) {
                local_af8 = local_af8 ^ 1L << (local_b70 & 0x3f);
              }
              else {
                pRVar28 = local_ae0->args;
                if ((pRVar28->filter == (RTCFilterFunctionN)0x0) &&
                   (local_b00->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01be3e51:
                  ray->tfar = -INFINITY;
                  return;
                }
                local_a60 = auVar83._0_16_;
                local_a50 = auVar82._0_16_;
                local_a40 = auVar81._0_16_;
                local_a30 = auVar80._0_16_;
                local_a20 = auVar79._0_16_;
                local_a10 = auVar78._0_16_;
                uVar25 = (ulong)(uint)((int)local_b70 * 4);
                local_a90.context = local_ae0->user;
                local_ac0 = *(undefined4 *)(local_880 + uVar25);
                local_abc = *(undefined4 *)(local_860 + uVar25);
                local_ab8 = *(undefined4 *)(local_840 + uVar25);
                local_ab4 = *(undefined4 *)(local_8e0 + uVar25);
                local_ab0 = *(undefined4 *)(local_8c0 + uVar25);
                local_aac = *(undefined4 *)((long)&local_a00 + uVar25);
                local_aa4 = (local_a90.context)->instID[0];
                local_aa0 = (local_a90.context)->instPrimID[0];
                fVar67 = ray->tfar;
                ray->tfar = *(float *)(local_8a0 + uVar25);
                local_b74 = -1;
                local_a90.valid = &local_b74;
                local_a90.geometryUserPtr = local_b00->userPtr;
                local_a90.hit = (RTCHitN *)&local_ac0;
                local_a90.N = 1;
                local_a90.ray = (RTCRayN *)ray;
                if (((local_b00->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                    (local_b08 = pRVar28, (*local_b00->occlusionFilterN)(&local_a90),
                    pRVar28 = local_b08, *local_a90.valid != 0)) &&
                   ((pRVar28->filter == (RTCFilterFunctionN)0x0 ||
                    ((((pRVar28->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      (((local_b00->field_8).field_0x2 & 0x40) == 0)) ||
                     ((*pRVar28->filter)(&local_a90), *local_a90.valid != 0)))))) goto LAB_01be3e51;
                ray->tfar = fVar67;
                local_af8 = local_af8 ^ 1L << (local_b70 & 0x3f);
                auVar78 = ZEXT1664(local_a10);
                auVar79 = ZEXT1664(local_a20);
                auVar80 = ZEXT1664(local_a30);
                auVar81 = ZEXT1664(local_a40);
                auVar82 = ZEXT1664(local_a50);
                auVar83 = ZEXT1664(local_a60);
                auVar74 = ZEXT1664(local_b30);
                auVar75 = ZEXT1664(local_b40);
                auVar65 = ZEXT1664(local_b50);
                auVar71 = ZEXT1664(local_b60);
                pSVar27 = local_b68;
                fVar62 = local_b20;
                fVar67 = fStack_b1c;
                fVar68 = fStack_b18;
                fVar69 = fStack_b14;
              }
            } while (local_af8 != 0);
          }
        }
        goto LAB_01be34e2;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }